

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_lower_Test::
~CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_lower_Test
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_lower_Test *this)

{
  void *in_RDI;
  
  ~CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_lower_Test
            ((CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_lower_Test *)
             0x27eed8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_lower)
{
  // Amount target_amount = Amount::CreateBySatoshiAmount(460000000);
  Amount target_amount = Amount::CreateBySatoshiAmount(468700000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 1);
  EXPECT_EQ(select_value.GetSatoshiValue(), 1250000000);
  EXPECT_EQ(fee.GetSatoshiValue(), 1800);
  if (ret.size() == 1) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(1250000000));
  }
  EXPECT_FALSE(use_bnb);
}